

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControlLabel::mouseReleaseEvent(ControlLabel *this,QMouseEvent *mouseEvent)

{
  if (*(int *)(mouseEvent + 0x40) == 1) {
    if (this->isPressed == true) {
      this->isPressed = false;
      _q_clicked(this);
      return;
    }
  }
  else {
    mouseEvent[0xc] = (QMouseEvent)0x0;
  }
  return;
}

Assistant:

void ControlLabel::mouseReleaseEvent(QMouseEvent *mouseEvent)
{
    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }
    if (isPressed) {
        isPressed = false;
        emit _q_clicked();
    }
}